

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O0

BinaryOperatorTypes *
soul::TypeRules::getTypesForBitwiseOp(BinaryOperatorTypes *__return_storage_ptr__,Type *a,Type *b)

{
  Type *a_00;
  bool bVar1;
  bool bVar2;
  ArraySize AVar3;
  ArraySize AVar4;
  bool local_11d;
  PrimitiveType local_e4;
  undefined1 local_e0 [8];
  Type vecType;
  Primitive intType;
  Type local_a8;
  Type local_90;
  Type local_78;
  Type local_60;
  Type local_38;
  Type *local_20;
  Type *b_local;
  Type *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = &__return_storage_ptr__->resultType;
  bVar1 = Type::isReference(a);
  if (bVar1) {
    Type::removeReference(&local_38,b_local);
    getTypesForBitwiseOp(__return_storage_ptr__,&local_38,local_20);
    Type::~Type(&local_38);
  }
  else {
    bVar1 = Type::isReference(local_20);
    a_00 = b_local;
    if (bVar1) {
      Type::removeReference(&local_60,local_20);
      getTypesForBitwiseOp(__return_storage_ptr__,a_00,&local_60);
      Type::~Type(&local_60);
    }
    else {
      bVar1 = Type::isBoundedInt(b_local);
      if (bVar1) {
        Type::Type(&local_78,int32);
        Type::removeReferenceIfPresent(&local_90,local_20);
        getTypesForBitwiseOp(__return_storage_ptr__,&local_78,&local_90);
        Type::~Type(&local_90);
        Type::~Type(&local_78);
      }
      else {
        bVar1 = Type::isBoundedInt(local_20);
        if (bVar1) {
          Type::removeReferenceIfPresent(&local_a8,b_local);
          Type::Type((Type *)&stack0xffffffffffffff40,int32);
          getTypesForBitwiseOp(__return_storage_ptr__,&local_a8,(Type *)&stack0xffffffffffffff40);
          Type::~Type((Type *)&stack0xffffffffffffff40);
          Type::~Type(&local_a8);
        }
        else {
          bVar1 = isTypeSuitableForBitwiseOp(b_local);
          if ((bVar1) && (bVar1 = isTypeSuitableForBitwiseOp(local_20), bVar1)) {
            AVar3 = Type::getVectorSize(b_local);
            AVar4 = Type::getVectorSize(local_20);
            if (AVar3 == AVar4) {
              bVar1 = Type::isVector(b_local);
              bVar2 = Type::isVector(local_20);
              if (bVar1 == bVar2) {
                bVar1 = Type::isInteger64(b_local);
                local_11d = true;
                if (!bVar1) {
                  local_11d = Type::isInteger64(local_20);
                }
                vecType.structure.object._4_4_ = int32;
                if (local_11d != false) {
                  vecType.structure.object._4_4_ = int64;
                }
                bVar1 = Type::isVector(b_local);
                if (!bVar1) {
                  Type::Type(&__return_storage_ptr__->resultType,vecType.structure.object._4_4_);
                  Type::Type(&__return_storage_ptr__->operandType,vecType.structure.object._4_4_);
                  return __return_storage_ptr__;
                }
                PrimitiveType::PrimitiveType(&local_e4,vecType.structure.object._4_4_);
                AVar3 = Type::getVectorSize(b_local);
                Type::createVector((Type *)local_e0,&local_e4,AVar3);
                Type::Type(&__return_storage_ptr__->resultType,(Type *)local_e0);
                Type::Type(&__return_storage_ptr__->operandType,(Type *)local_e0);
                Type::~Type((Type *)local_e0);
                return __return_storage_ptr__;
              }
            }
          }
          memset(__return_storage_ptr__,0,0x18);
          Type::Type(&__return_storage_ptr__->resultType);
          memset(&__return_storage_ptr__->operandType,0,0x18);
          Type::Type(&__return_storage_ptr__->operandType);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static BinaryOperatorTypes getTypesForBitwiseOp (const Type& a, const Type& b)
    {
        if (a.isReference())  return getTypesForBitwiseOp (a.removeReference(), b);
        if (b.isReference())  return getTypesForBitwiseOp (a, b.removeReference());

        if (a.isBoundedInt())  return getTypesForBitwiseOp (PrimitiveType::int32, b.removeReferenceIfPresent());
        if (b.isBoundedInt())  return getTypesForBitwiseOp (a.removeReferenceIfPresent(), PrimitiveType::int32);

        if (isTypeSuitableForBitwiseOp (a)
             && isTypeSuitableForBitwiseOp (b)
             && a.getVectorSize() == b.getVectorSize()
             && a.isVector() == b.isVector())
        {
            auto intType = (a.isInteger64() || b.isInteger64()) ? PrimitiveType::int64 : PrimitiveType::int32;

            if (! a.isVector())
                return { intType, intType };

            auto vecType = Type::createVector (intType, a.getVectorSize());
            return { vecType, vecType };
        }

        return {};
    }